

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O2

void Assimp::Write(JSONWriter *out,aiNodeAnim *ai,bool is_elem)

{
  aiVectorKey *paVar1;
  aiQuatKey *paVar2;
  aiNodeAnim *paVar3;
  uint n;
  long lVar4;
  ulong uVar5;
  allocator<char> local_61;
  aiNodeAnim *local_60;
  string local_58;
  ulong local_38;
  
  local_60 = ai;
  JSONWriter::StartObj(out,is_elem);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"name",&local_61);
  JSONWriter::Key(out,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  JSONWriter::SimpleValue<aiString>(out,&local_60->mNodeName);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"prestate",&local_61);
  JSONWriter::Key(out,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  JSONWriter::SimpleValue<aiAnimBehaviour>(out,&local_60->mPreState);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"poststate",&local_61);
  JSONWriter::Key(out,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  paVar3 = local_60;
  JSONWriter::SimpleValue<aiAnimBehaviour>(out,&local_60->mPostState);
  if (paVar3->mNumPositionKeys != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"positionkeys",&local_61)
    ;
    JSONWriter::Key(out,&local_58);
    lVar4 = 8;
    std::__cxx11::string::~string((string *)&local_58);
    JSONWriter::StartArray(out,false);
    for (uVar5 = 0; uVar5 < local_60->mNumPositionKeys; uVar5 = uVar5 + 1) {
      paVar1 = local_60->mPositionKeys;
      local_38 = uVar5;
      JSONWriter::StartArray(out,true);
      JSONWriter::Element<double>(out,(double *)((long)paVar1 + lVar4 + -8));
      uVar5 = local_38;
      Write(out,(aiVector3D *)((long)&paVar1->mTime + lVar4),true);
      JSONWriter::EndArray(out);
      lVar4 = lVar4 + 0x18;
    }
    JSONWriter::EndArray(out);
  }
  if (local_60->mNumRotationKeys != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"rotationkeys",&local_61)
    ;
    JSONWriter::Key(out,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    JSONWriter::StartArray(out,false);
    lVar4 = 8;
    for (uVar5 = 0; uVar5 < local_60->mNumRotationKeys; uVar5 = uVar5 + 1) {
      paVar2 = local_60->mRotationKeys;
      JSONWriter::StartArray(out,true);
      JSONWriter::Element<double>(out,(double *)((long)paVar2 + lVar4 + -8));
      Write(out,(aiQuaternion *)((long)&paVar2->mTime + lVar4),true);
      JSONWriter::EndArray(out);
      lVar4 = lVar4 + 0x18;
    }
    JSONWriter::EndArray(out);
  }
  if (local_60->mNumScalingKeys != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"scalingkeys",&local_61);
    JSONWriter::Key(out,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    JSONWriter::StartArray(out,false);
    lVar4 = 8;
    for (uVar5 = 0; uVar5 < local_60->mNumScalingKeys; uVar5 = uVar5 + 1) {
      paVar1 = local_60->mScalingKeys;
      JSONWriter::StartArray(out,true);
      JSONWriter::Element<double>(out,(double *)((long)paVar1 + lVar4 + -8));
      Write(out,(aiVector3D *)((long)&paVar1->mTime + lVar4),true);
      JSONWriter::EndArray(out);
      lVar4 = lVar4 + 0x18;
    }
    JSONWriter::EndArray(out);
  }
  JSONWriter::EndObj(out);
  return;
}

Assistant:

void Write(JSONWriter& out, const aiNodeAnim& ai, bool is_elem = true) {
    out.StartObj(is_elem);

    out.Key("name");
    out.SimpleValue(ai.mNodeName);

    out.Key("prestate");
    out.SimpleValue(ai.mPreState);

    out.Key("poststate");
    out.SimpleValue(ai.mPostState);

    if (ai.mNumPositionKeys) {
        out.Key("positionkeys");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumPositionKeys; ++n) {
            const aiVectorKey& pos = ai.mPositionKeys[n];
            out.StartArray(true);
            out.Element(pos.mTime);
            Write(out, pos.mValue);
            out.EndArray();
        }
        out.EndArray();
    }

    if (ai.mNumRotationKeys) {
        out.Key("rotationkeys");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumRotationKeys; ++n) {
            const aiQuatKey& rot = ai.mRotationKeys[n];
            out.StartArray(true);
            out.Element(rot.mTime);
            Write(out, rot.mValue);
            out.EndArray();
        }
        out.EndArray();
    }

    if (ai.mNumScalingKeys) {
        out.Key("scalingkeys");
        out.StartArray();
        for (unsigned int n = 0; n < ai.mNumScalingKeys; ++n) {
            const aiVectorKey& scl = ai.mScalingKeys[n];
            out.StartArray(true);
            out.Element(scl.mTime);
            Write(out, scl.mValue);
            out.EndArray();
        }
        out.EndArray();
    }
    out.EndObj();
}